

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O2

int trans_scanner_block_cmp_fn(ScannerBlock *a,ScannerBlock *b,hash_fns_t *fns)

{
  ScanStateTransition *pSVar1;
  ScanStateTransition *pSVar2;
  void *pvVar3;
  void *pvVar4;
  
  pvVar3 = fns->data[0];
  if ((long)fns->data[0] < 1) {
    pvVar3 = (void *)0x0;
  }
  pvVar4 = (void *)0x0;
  while( true ) {
    if (pvVar3 == pvVar4) {
      return 0;
    }
    pSVar1 = a->transitions[(long)pvVar4];
    pSVar2 = b->transitions[(long)pvVar4];
    if ((pSVar1 != pSVar2) &&
       (((pSVar1 == (ScanStateTransition *)0x0 || (pSVar2 == (ScanStateTransition *)0x0)) ||
        (pSVar1->index != pSVar2->index)))) break;
    pvVar4 = (void *)((long)pvVar4 + 1);
  }
  return 1;
}

Assistant:

static int trans_scanner_block_cmp_fn(ScannerBlock *a, ScannerBlock *b, hash_fns_t *fns) {
  intptr_t i, block_size = (intptr_t)fns->data[0];
  ScanStateTransition **sa = a->transitions;
  ScanStateTransition **sb = b->transitions;

  for (i = 0; i < block_size; i++) {
    if (sa[i] == sb[i]) continue;
    if (!sa[i] || !sb[i]) return 1;
    if (sa[i]->index != sb[i]->index) return 1;
  }
  return 0;
}